

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O1

bool __thiscall QComboBox::event(QComboBox *this,QEvent *event)

{
  ushort uVar1;
  QComboBoxPrivate *this_00;
  QLineEdit *pQVar2;
  bool bVar3;
  undefined1 uVar4;
  undefined4 uVar5;
  uint uVar6;
  ulong uVar7;
  QHoverEvent *he;
  ulong uVar8;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  undefined1 auVar9 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar10 [16];
  QPoint local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QComboBoxPrivate **)&(this->super_QWidget).field_0x8;
  uVar1 = *(ushort *)(event + 8);
  if (uVar1 < 0x7f) {
    if (uVar1 == 0x25) {
LAB_003e3051:
      QComboBoxPrivate::updateLayoutDirection(this_00);
      QComboBoxPrivate::updateLineEditGeometry(this_00);
    }
    else if (uVar1 == 0x33) {
      pQVar2 = this_00->lineEdit;
      if (pQVar2 != (QLineEdit *)0x0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          uVar4 = (**(code **)(*(long *)&pQVar2->super_QWidget + 0x28))(pQVar2,event);
          return (bool)uVar4;
        }
        goto LAB_003e3142;
      }
    }
    else if (uVar1 == 0x5a) goto LAB_003e3051;
  }
  else if (uVar1 - 0x7f < 3) {
    uVar5 = QEventPoint::position();
    auVar10._0_8_ =
         (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
         extraout_XMM1_Qa;
    auVar10._8_8_ =
         (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
         extraout_XMM0_Qa;
    auVar10 = minpd(_DAT_0066f5d0,auVar10);
    auVar9._8_8_ = -(ulong)(-2147483648.0 < auVar10._8_8_);
    auVar9._0_8_ = -(ulong)(-2147483648.0 < auVar10._0_8_);
    uVar6 = movmskpd(uVar5,auVar9);
    uVar8 = 0x8000000000000000;
    if ((uVar6 & 1) != 0) {
      uVar8 = (ulong)(uint)(int)auVar10._0_8_ << 0x20;
    }
    uVar7 = 0x80000000;
    if ((uVar6 & 2) != 0) {
      uVar7 = (ulong)(uint)(int)auVar10._8_8_;
    }
    local_28 = (QPoint)(uVar7 | uVar8);
    QComboBoxPrivate::updateHoverControl(this_00,&local_28);
  }
  bVar3 = QWidget::event(&this->super_QWidget,event);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar3;
  }
LAB_003e3142:
  __stack_chk_fail();
}

Assistant:

bool QComboBox::event(QEvent *event)
{
    Q_D(QComboBox);
    switch(event->type()) {
    case QEvent::LayoutDirectionChange:
    case QEvent::ApplicationLayoutDirectionChange:
        d->updateLayoutDirection();
        d->updateLineEditGeometry();
        break;
    case QEvent::HoverEnter:
    case QEvent::HoverLeave:
    case QEvent::HoverMove:
        if (const QHoverEvent *he = static_cast<const QHoverEvent *>(event))
            d->updateHoverControl(he->position().toPoint());
        break;
    case QEvent::ShortcutOverride:
        if (d->lineEdit)
            return d->lineEdit->event(event);
        break;
#ifdef QT_KEYPAD_NAVIGATION
    case QEvent::EnterEditFocus:
        if (d->lineEdit)
            d->lineEdit->event(event);  //so cursor starts
        break;
    case QEvent::LeaveEditFocus:
        if (d->lineEdit)
            d->lineEdit->event(event);  //so cursor stops
        break;
#endif
    default:
        break;
    }
    return QWidget::event(event);
}